

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O0

void __thiscall glslang::TLiveTraverser::~TLiveTraverser(TLiveTraverser *this)

{
  void *in_RSI;
  TLiveTraverser *this_local;
  
  ~TLiveTraverser(this);
  TIntermTraverser::operator_delete(&this->super_TIntermTraverser,in_RSI);
  return;
}

Assistant:

TLiveTraverser(const TIntermediate& i, bool traverseAll = false,
                   bool preVisit = true, bool inVisit = false, bool postVisit = false) :
        TIntermTraverser(preVisit, inVisit, postVisit),
        intermediate(i), traverseAll(traverseAll)
    { }